

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

Am_Object find_obj_slot(int x,int y,Am_Object *ref_obj,bool source,Am_Slot_Key *slot,Places *place)

{
  undefined2 uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  undefined7 in_register_00000009;
  Am_Slot_Key *pAVar6;
  char *pcVar7;
  undefined4 in_register_0000003c;
  Am_Object AVar8;
  ostream *poVar9;
  int *in_stack_00000008;
  Am_Object obj;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Places *local_58;
  Am_Object_Data *local_50;
  Am_Value v;
  
  local_50 = (Am_Object_Data *)CONCAT44(in_register_0000003c,x);
  local_58 = place;
  Am_Point_In_Part(&obj,0x110470,y,(Am_Object *)((ulong)ref_obj & 0xffffffff),source,false);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  cVar2 = Am_Object::Valid();
  pcVar7 = "** Wrong type obj for wire: ";
  poVar9 = (ostream *)&std::cout;
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&local_60,&circuit_object_proto);
    AVar8.data = (Am_Object_Data *)&obj;
    cVar2 = Am_Object::Is_Instance_Of(AVar8);
    Am_Object::~Am_Object(&local_60);
    if (cVar2 != '\0') {
      if ((char)slot != '\0') {
        *(Am_Slot_Key *)local_58 = OUTPUT_1;
        *in_stack_00000008 = 3;
        goto LAB_001066b2;
      }
      Am_Object::Am_Object(&local_78,&zero_one_proto);
      cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&obj);
      if (cVar2 == '\0') {
        Am_Object::Am_Object(&local_68,&not_proto);
        cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&obj);
        Am_Object::~Am_Object(&local_68);
        Am_Object::~Am_Object(&local_78);
        if (cVar2 != '\0') goto LAB_001065c3;
        bVar3 = is_at_top((int)ref_obj,(Am_Object *)CONCAT71(in_register_00000009,source),&obj);
        pAVar6 = &INPUT_2;
        if (bVar3) {
          pAVar6 = &INPUT_1;
        }
        iVar4 = 2 - (uint)bVar3;
      }
      else {
        Am_Object::~Am_Object(&local_78);
LAB_001065c3:
        iVar4 = 0;
        pAVar6 = &INPUT_1;
      }
      uVar1 = *pAVar6;
      *(undefined2 *)local_58 = uVar1;
      *in_stack_00000008 = iVar4;
      AVar8.data = (Am_Object_Data *)&obj;
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)AVar8.data,(ulong)(ushort)uVar1);
      Am_Value::operator=(&v,pAVar5);
      cVar2 = Am_Value::Valid();
      if (cVar2 == '\0') goto LAB_001066b2;
      poVar9 = std::operator<<((ostream *)&std::cout,"** Object at output end ");
      poVar9 = (ostream *)operator<<(poVar9,&obj);
      pcVar7 = " already has another object as input= ";
    }
  }
  poVar9 = std::operator<<(poVar9,pcVar7);
  poVar9 = (ostream *)operator<<(poVar9,&obj);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::ostream::flush();
  Am_Object::Am_Object(&local_70,&circuit_win);
  Am_Beep((Am_Object_Data *)&local_70);
  Am_Object::~Am_Object(&local_70);
  AVar8.data = (Am_Object_Data *)&Am_No_Object;
LAB_001066b2:
  Am_Object::Am_Object((Am_Object *)local_50,(Am_Object *)AVar8.data);
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&obj);
  return (Am_Object)local_50;
}

Assistant:

Am_Object find_obj_slot(int x, int y, Am_Object &ref_obj, bool source,
			Am_Slot_Key &slot, Places &place) {
  Am_Object obj = Am_Point_In_Part(created_objs, x, y, ref_obj);
  Am_Value v;
  if (obj.Valid() && obj.Is_Instance_Of(circuit_object_proto)) {
    if (source) {
      slot = OUTPUT_1;
      place = center_right;
      return obj;
    }
    else { // is destination
      if (obj.Is_Instance_Of(zero_one_proto) ||
	  obj.Is_Instance_Of(not_proto)) {
	slot = INPUT_1;
	place = center_left;
      }
      else {
	if (is_at_top(y, ref_obj, obj)) {
	  slot = INPUT_1;
	  place = top_left;
	}
	else {
	  slot = INPUT_2;
	  place = bottom_left;
	}
      }
      // destinations can only have one per place
      v = obj.Peek(slot);
      if (v.Valid()) 
	cout << "** Object at output end " << obj
	     << " already has another object as input= " << obj
	     << endl << flush;
      else return obj;
    }
  }
  else cout << "** Wrong type obj for wire: " << obj << endl << flush;
  //if get here, then failed
  Am_Beep(circuit_win);
  return Am_No_Object;
}